

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

void Internal_WeldAndAddNgon
               (ON_Mesh *mesh,ON_MeshTopology *top,uchar xmark,uchar *fmarks,
               ON_SimpleArray<unsigned_int> *ngon_fi)

{
  byte *pbVar1;
  ON_MeshTopologyFace *pOVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ON_MeshTopologyFace *pOVar8;
  ON_MeshFace *pOVar9;
  ON_MeshTopologyEdge *pOVar10;
  undefined1 auVar11 [16];
  int iVar12;
  uint nfi;
  long lVar13;
  int *piVar14;
  int iVar15;
  undefined7 in_register_00000011;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  ON_MeshFace f [2];
  ON_MeshFace local_b8;
  ON_MeshFace *local_a8;
  ON_MeshTopologyVertex *local_a0;
  int *local_98;
  ON_MeshTopologyFace *local_90;
  long local_88;
  long local_80;
  long local_78;
  int *local_70;
  long local_68;
  long local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar17 = CONCAT71(in_register_00000011,xmark);
  local_80 = (long)*(int *)(fmarks + 0x10);
  if (local_80 < 2) {
    return;
  }
  lVar13 = 0;
  do {
    pbVar1 = (byte *)(lVar17 + (ulong)*(uint *)(*(long *)(fmarks + 8) + lVar13 * 4));
    *pbVar1 = *pbVar1 | 0x10;
    lVar13 = lVar13 + 1;
  } while (local_80 != lVar13);
  local_88 = *(long *)(fmarks + 8);
  pOVar8 = (top->m_topf).m_a;
  pOVar9 = (mesh->m_F).m_a;
  local_a0 = (top->m_topv).m_a;
  pOVar10 = (top->m_tope).m_a;
  lVar13 = 0;
  do {
    local_78 = lVar13;
    iVar3 = *(int *)(local_88 + local_78 * 4);
    local_90 = pOVar8 + iVar3;
    local_a8 = pOVar9 + iVar3;
    local_70 = pOVar9[iVar3].vi + 3;
    local_68 = 4 - (ulong)(local_90->m_topei[0] != local_90->m_topei[1] &&
                          local_90->m_topei[2] == local_90->m_topei[3]);
    lVar13 = 0;
    do {
      iVar4 = pOVar10[local_90->m_topei[lVar13]].m_topvi[local_90->m_reve[lVar13] == '\0'];
      if ((1 < local_a0[iVar4].m_v_count) && (local_a0[iVar4].m_vi != (int *)0x0)) {
        local_98 = local_a8->vi + lVar13;
        iVar21 = *local_98;
        bVar26 = true;
        iVar22 = iVar21;
        do {
          if (0 < local_a0[iVar4].m_v_count) {
            iVar15 = 0;
            do {
              iVar5 = local_90->m_topei[lVar13];
              if (0 < pOVar10[iVar5].m_topf_count) {
                piVar14 = pOVar10[iVar5].m_topfi;
                lVar25 = 0;
                do {
                  lVar24 = (long)piVar14[lVar25];
                  if ((iVar3 != piVar14[lVar25]) && (*(char *)(lVar17 + lVar24) != '\0')) {
                    pOVar2 = pOVar8 + lVar24;
                    bVar27 = pOVar2->m_topei[2] == pOVar2->m_topei[3];
                    bVar28 = pOVar2->m_topei[0] != pOVar2->m_topei[1];
                    lVar16 = 0;
                    do {
                      iVar12 = iVar22;
                      if (iVar4 == pOVar10[pOVar2->m_topei[lVar16]].m_topvi
                                   [pOVar2->m_reve[lVar16] == '\0']) {
                        if (bVar26) {
                          iVar6 = pOVar9[lVar24].vi[lVar16];
                          iVar12 = iVar6;
                          if ((iVar22 <= iVar6) && (iVar12 = iVar22, iVar21 < iVar6)) {
                            iVar21 = iVar6;
                          }
                        }
                        else if ((lVar16 == 2) && (pOVar9[lVar24].vi[2] == pOVar9[lVar24].vi[3])) {
                          pOVar9[lVar24].vi[2] = iVar22;
                          pOVar9[lVar24].vi[3] = iVar22;
                        }
                        else {
                          pOVar9[lVar24].vi[lVar16] = iVar22;
                        }
                      }
                      iVar22 = iVar12;
                      lVar16 = lVar16 + 1;
                    } while (4 - (ulong)(bVar28 && bVar27) != lVar16);
                    if (bVar28 && bVar27) {
                      pOVar9[lVar24].vi[3] = pOVar9[lVar24].vi[2];
                    }
                  }
                  lVar25 = lVar25 + 1;
                } while (lVar25 < pOVar10[iVar5].m_topf_count);
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < local_a0[iVar4].m_v_count);
          }
          local_60 = lVar13;
          if (!bVar26) {
            piVar14 = local_98;
            if ((lVar13 == 2) && (local_a8->vi[2] == local_a8->vi[3])) {
              local_a8->vi[2] = iVar22;
              piVar14 = local_70;
            }
            *piVar14 = iVar22;
            break;
          }
          bVar26 = false;
        } while (iVar22 != iVar21);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != local_68);
    lVar13 = local_78 + 1;
  } while (local_78 + 1 != local_80);
  lVar13 = 0;
  do {
    pbVar1 = (byte *)(lVar17 + (ulong)*(uint *)(*(long *)(fmarks + 8) + lVar13 * 4));
    *pbVar1 = *pbVar1 & 0xef;
    lVar13 = lVar13 + 1;
  } while (local_80 != lVar13);
  if (*(int *)(fmarks + 0x10) == 2) {
    uVar20 = **(uint **)(fmarks + 8);
    uVar7 = (*(uint **)(fmarks + 8))[1];
    if (((uVar20 != uVar7) &&
        (pOVar9 = (mesh->m_F).m_a, pOVar9[uVar20].vi[2] == pOVar9[uVar20].vi[3])) &&
       (pOVar9[uVar7].vi[2] == pOVar9[uVar7].vi[3])) {
      local_58 = *(undefined8 *)pOVar9[uVar20].vi;
      uStack_50 = *(undefined8 *)(pOVar9[uVar20].vi + 2);
      local_48 = *(undefined8 *)pOVar9[uVar7].vi;
      uStack_40 = *(undefined8 *)(pOVar9[uVar7].vi + 2);
      bVar26 = false;
      uVar18 = 0;
      do {
        iVar3 = *(int *)((long)&local_58 + uVar18 * 4);
        uVar19 = uVar18 + 1;
        uVar23 = 0;
        if (uVar19 != 3) {
          uVar23 = uVar19 & 0xffffffff;
        }
        iVar4 = *(int *)((long)&local_58 + uVar23 * 4);
        uVar20 = (uint)(uVar18 + 2);
        uVar23 = 2;
        lVar17 = 1;
        do {
          auVar11._8_8_ = 0;
          auVar11._0_8_ = uVar23;
          lVar13 = 0;
          if (lVar17 != 3) {
            lVar13 = lVar17;
          }
          iVar21 = 7;
          if ((iVar3 == *(int *)((long)&local_48 + lVar13 * 4)) &&
             (iVar4 == *(int *)((long)&uStack_50 + lVar17 * 4 + 4))) {
            local_b8.vi[uVar18] = iVar3;
            local_b8.vi[uVar18 + 1] =
                 *(int *)((long)&local_48 +
                         lVar17 * 4 +
                         (SUB168(auVar11 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffcU)
                         * -3 + 4);
            local_b8.vi[uVar20 & 3] = iVar4;
            local_b8.vi[(int)uVar18 - 1U & 3] =
                 *(int *)((long)&local_58 +
                         (ulong)(uVar20 + (int)((uVar18 + 2 & 0xffffffff) / 3) * -3) * 4);
            iVar21 = 0;
            if ((local_b8.vi[2] != local_b8.vi[3]) &&
               (bVar27 = ON_MeshFace::IsValid
                                   (&local_b8,(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count),
               iVar21 = 0, bVar27)) {
              pOVar9 = (mesh->m_F).m_a + **(uint **)(fmarks + 8);
              *(ulong *)pOVar9->vi = CONCAT44(local_b8.vi[1],local_b8.vi[0]);
              *(ulong *)(pOVar9->vi + 2) = CONCAT44(local_b8.vi[3],local_b8.vi[2]);
              local_b8.vi[0] = -1;
              local_b8.vi[1] = -1;
              local_b8.vi[2] = -1;
              local_b8.vi[3] = -1;
              pOVar9 = (mesh->m_F).m_a + *(uint *)(*(long *)(fmarks + 8) + 4);
              pOVar9->vi[0] = -1;
              pOVar9->vi[1] = -1;
              pOVar9->vi[2] = -1;
              pOVar9->vi[3] = -1;
              if (0 < *(int *)(fmarks + 0x14)) {
                fmarks[0x10] = '\x01';
                fmarks[0x11] = '\0';
                fmarks[0x12] = '\0';
                fmarks[0x13] = '\0';
              }
              iVar21 = 1;
              ON_Mesh::AddNgon(mesh,1,*(uint **)(fmarks + 8));
            }
          }
          if ((iVar21 != 7) && (iVar21 != 0)) goto LAB_0051eebd;
          uVar23 = uVar23 + 1;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        iVar21 = 5;
LAB_0051eebd:
        if ((iVar21 != 5) && (iVar21 != 0)) {
          if (!bVar26) {
            return;
          }
          break;
        }
        bVar26 = 1 < uVar18;
        uVar18 = uVar19;
      } while (uVar19 != 3);
    }
  }
  ON_Mesh::AddNgon(mesh,*(uint *)(fmarks + 0x10),*(uint **)(fmarks + 8));
  return;
}

Assistant:

static void Internal_WeldAndAddNgon(
  ON_Mesh& mesh,
  const ON_MeshTopology& top,
  const unsigned char xmark,
  unsigned char* fmarks,
   ON_SimpleArray<unsigned>& ngon_fi
)
{
  if (ngon_fi.Count() < 2)
    return;

  // ngons must be welded and MergeFaces supports making an ngon across an unwelded edge.
  Internal_WeldNgonCandiate(mesh,top,fmarks,xmark,ngon_fi);

  if (
    2 == ngon_fi.Count() 
    &&ngon_fi[0] != ngon_fi[1]
    && mesh.m_F[ngon_fi[0]].IsTriangle() 
    && mesh.m_F[ngon_fi[1]].IsTriangle()
    )
  {
    // make a single quad face
    ON_MeshFace f[2] = {mesh.m_F[ngon_fi[0]],mesh.m_F[ngon_fi[1]]};
    for (int f0ei = 0; f0ei < 3; ++f0ei)
    {
      const int f0vi[2] = { f[0].vi[f0ei],f[0].vi[(f0ei + 1) % 3] };
      for (int f1ei = 0; f1ei < 3; ++f1ei)
      {
        const int f1vi[2] = { f[1].vi[f1ei],f[1].vi[(f1ei + 1) % 3] };
        if (f0vi[0] != f1vi[1] || f0vi[1] != f1vi[0])
          continue;
        // merge triangles into a quad
        ON_MeshFace q;
        q.vi[f0ei] = f[0].vi[f0ei];
        q.vi[(f0ei+1)%4] = f[1].vi[(f1ei+2)%3];
        q.vi[(f0ei+2)%4] = f[0].vi[(f0ei+1)%3];
        q.vi[(f0ei+3)%4] = f[0].vi[(f0ei+2)%3];
        if (q.IsQuad() && q.IsValid(mesh.m_V.Count()))
        {
          mesh.m_F[ngon_fi[0]] = q;
          q.vi[0] = -1;
          q.vi[1] = -1;
          q.vi[2] = -1;
          q.vi[3] = -1;
          mesh.m_F[ngon_fi[1]] = q;
          ngon_fi.SetCount(1);
          mesh.AddNgon(1, ngon_fi.Array());
          return;
        }
      }
    }
  }

  mesh.AddNgon(ngon_fi.UnsignedCount(), ngon_fi.Array());
}